

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_msg_header_chop_u32(nng_msg *msg,uint32_t *val)

{
  size_t sVar1;
  void *pvVar2;
  uint32_t v;
  uint8_t *header;
  uint32_t *val_local;
  nng_msg *msg_local;
  
  sVar1 = nng_msg_header_len(msg);
  if (sVar1 < 4) {
    msg_local._4_4_ = 3;
  }
  else {
    pvVar2 = nng_msg_header(msg);
    sVar1 = nng_msg_header_len(msg);
    *val = (uint)*(byte *)((long)pvVar2 + (sVar1 - 4)) * 0x1000000 +
           (uint)*(byte *)((long)pvVar2 + (sVar1 - 3)) * 0x10000 +
           (uint)*(byte *)((long)pvVar2 + (sVar1 - 2)) * 0x100 +
           (uint)*(byte *)((long)pvVar2 + (sVar1 - 1));
    nni_msg_header_chop(msg,4);
    msg_local._4_4_ = 0;
  }
  return msg_local._4_4_;
}

Assistant:

int
nng_msg_header_chop_u32(nng_msg *msg, uint32_t *val)
{
	uint8_t *header;
	uint32_t v;
	if (nng_msg_header_len(msg) < sizeof(*val)) {
		return (NNG_EINVAL);
	}
	header = nng_msg_header(msg);
	header += nng_msg_header_len(msg);
	header -= sizeof(v);
	NNI_GET32(header, v);
	*val = v;
	nni_msg_header_chop(msg, sizeof(v));
	return (0);
}